

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0040(TypeCanonicalizerAndResolverTester *this)

{
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = 
  "\nstruct {\n    struct {\n        struct c {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct c x ;\n}\n"
  ;
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\nstruct {\n    struct {\n        struct c {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct c x ;\n}\n"
             ,&local_39);
  Expectation::Expectation(&local_108);
  canonicalizerAndResolveTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0040()
{
    auto s = R"(
struct {
    struct {
        struct c {
            const int m ;
        } ;
    } ;
} ;
void _ ()
{
    struct c x ;
}
)";

    canonicalizerAndResolveTypes(s, Expectation());
}